

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall glslang::HlslGrammar::acceptDefaultLabel(HlslGrammar *this,TIntermNode **statement)

{
  bool bVar1;
  TIntermBranch *pTVar2;
  undefined1 local_38 [8];
  TSourceLoc loc;
  TIntermNode **statement_local;
  HlslGrammar *this_local;
  
  local_38 = (undefined1  [8])(this->super_HlslTokenStream).token.loc.name;
  loc.name = *(TString **)&(this->super_HlslTokenStream).token.loc.string;
  loc.string = (this->super_HlslTokenStream).token.loc.column;
  loc.line = *(int *)&(this->super_HlslTokenStream).token.loc.field_0x14;
  loc._16_8_ = statement;
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokDefault);
  if (bVar1) {
    bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokColon);
    if (bVar1) {
      pTVar2 = TIntermediate::addBranch
                         ((this->parseContext->super_TParseContextBase).super_TParseVersions.
                          intermediate,EOpDefault,(TSourceLoc *)local_38);
      *(TIntermBranch **)loc._16_8_ = pTVar2;
      this_local._7_1_ = true;
    }
    else {
      expected(this,":");
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool HlslGrammar::acceptDefaultLabel(TIntermNode*& statement)
{
    TSourceLoc loc = token.loc;
    if (! acceptTokenClass(EHTokDefault))
        return false;

    if (! acceptTokenClass(EHTokColon)) {
        expected(":");
        return false;
    }

    statement = parseContext.intermediate.addBranch(EOpDefault, loc);

    return true;
}